

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetadataTree.cpp
# Opt level: O2

Node * __thiscall
cali::internal::MetadataTree::get_path
          (MetadataTree *this,Attribute *attr,size_t n,Variant *data,Node *parent)

{
  bool bVar1;
  Node *pNVar2;
  cali_id_t attr_00;
  long lVar3;
  
  if (parent == (Node *)0x0) {
    parent = (Node *)((long)mG._M_b._M_p + 0x10);
  }
  lVar3 = 0;
  do {
    if (n - lVar3 == 0) {
      return parent;
    }
    pNVar2 = *(Node **)((long)&((parent->super_LockfreeIntrusiveTree<cali::Node>).m_me)->m_id +
                       (parent->super_LockfreeIntrusiveTree<cali::Node>).m_node);
    while( true ) {
      if (pNVar2 == (Node *)0x0) {
        pNVar2 = create_path(this,attr,n - lVar3,data + lVar3,parent);
        return pNVar2;
      }
      attr_00 = 0xffffffffffffffff;
      if (attr->m_node != (Node *)0x0) {
        attr_00 = attr->m_node->m_id;
      }
      bVar1 = Node::equals(pNVar2,attr_00,data + lVar3);
      if (bVar1) break;
      pNVar2 = *(Node **)((long)&(((pNVar2->super_LockfreeIntrusiveTree<cali::Node>).m_me)->
                                 super_LockfreeIntrusiveTree<cali::Node>).m_node +
                         (pNVar2->super_LockfreeIntrusiveTree<cali::Node>).m_node);
    }
    lVar3 = lVar3 + 1;
    parent = pNVar2;
  } while( true );
}

Assistant:

Node* MetadataTree::get_path(const Attribute& attr, size_t n, const Variant* data, Node* parent = nullptr)
{
    Node*  node = parent ? parent : &(mG.load()->root);
    size_t base = 0;

    for (size_t i = 0; i < n; ++i) {
        parent = node;

        for (node = parent->first_child(); node && !node->equals(attr.id(), data[i]); node = node->next_sibling())
            ;

        if (!node)
            break;

        ++base;
    }

    if (!node)
        node = create_path(attr, n - base, data + base, parent);

    return node;
}